

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall Clasp::SatBuilder::doEndProgram(SatBuilder *this)

{
  int iVar1;
  WeightLiteral x;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  size_type sVar5;
  reference this_00;
  SharedContext *pSVar6;
  byte *pbVar7;
  ProgramBuilder *in_RDI;
  Result RVar8;
  uint32 m;
  Var v;
  bool elim;
  uint32 seen;
  Literal relax;
  weight_t w;
  const_iterator end;
  const_iterator it;
  LitVec cc;
  uint32 softVars;
  bool ok;
  undefined4 in_stack_fffffffffffffee8;
  Var in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  size_type sVar9;
  uint in_stack_fffffffffffffef4;
  ProgramBuilder *in_stack_fffffffffffffef8;
  Literal in_stack_ffffffffffffff00;
  Status in_stack_ffffffffffffff04;
  ClauseHead *in_stack_ffffffffffffff08;
  Solver *in_stack_ffffffffffffff10;
  Solver *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  byte local_b9;
  size_type local_94;
  pair<Clasp::Literal,_int> local_78;
  ClauseHead *local_70;
  Status local_68;
  ConstraintInfo local_5c;
  Result local_58;
  Literal local_48;
  uint32 local_44;
  iterator local_40;
  iterator local_28;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_20;
  int local_10;
  byte local_9;
  
  ProgramBuilder::ctx(in_RDI);
  local_9 = SharedContext::ok((SharedContext *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  bVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     &in_RDI[1].parser_);
  if ((!bVar3) && ((local_9 & 1) != 0)) {
    ProgramBuilder::ctx(in_RDI);
    SharedContext::setPreserveModels
              ((SharedContext *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               SUB41(in_stack_fffffffffffffeec >> 0x18,0));
    iVar1 = *(int *)&in_RDI[2].frozen_;
    ProgramBuilder::ctx(in_RDI);
    uVar4 = SharedContext::numVars((SharedContext *)0x1cabba);
    local_10 = iVar1 - uVar4;
    ProgramBuilder::ctx(in_RDI);
    SharedContext::addVars
              ((SharedContext *)in_stack_ffffffffffffff10,
               (uint32)((ulong)in_stack_ffffffffffffff08 >> 0x20),(VarType)in_stack_ffffffffffffff08
               ,(uint8)(in_stack_ffffffffffffff04 >> 0x18));
    ProgramBuilder::ctx(in_RDI);
    SharedContext::startAddConstraints
              ((SharedContext *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (uint32)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               in_stack_ffffffffffffff10);
    local_28 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          &in_RDI[1].parser_);
    local_40 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          &in_RDI[1].parser_);
    while( true ) {
      local_b9 = 0;
      if (local_28 != local_40) {
        local_b9 = local_9;
      }
      if ((local_b9 & 1) == 0) break;
      local_44 = Literal::rep(local_28);
      local_48.rep_ = local_28[1].rep_;
      local_28 = local_28 + 1;
      bVar3 = Literal::flagged(&local_48);
      if (!bVar3) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.rep_),
                   (size_type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (Literal *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        do {
          local_28 = local_28 + 1;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.rep_),
                     (Literal *)in_stack_fffffffffffffef8);
          this_00 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back
                              (&local_20);
          bVar3 = Literal::flagged(this_00);
        } while (((bVar3 ^ 0xffU) & 1) != 0);
        in_stack_ffffffffffffff20 =
             (Solver *)
             bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back(&local_20);
        Literal::unflag((Literal *)in_stack_ffffffffffffff20);
        pSVar6 = ProgramBuilder::ctx(in_RDI);
        in_stack_ffffffffffffff10 = SharedContext::master((SharedContext *)0x1cad8f);
        ConstraintInfo::ConstraintInfo(&local_5c,Static);
        RVar8 = ClauseCreator::create
                          (in_stack_ffffffffffffff20,(LitVec *)pSVar6,
                           (uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                           (ConstraintInfo *)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff08 = RVar8.local;
        in_stack_ffffffffffffff04 = RVar8.status;
        local_70 = in_stack_ffffffffffffff08;
        local_68 = in_stack_ffffffffffffff04;
        local_58.local = in_stack_ffffffffffffff08;
        local_58.status = in_stack_ffffffffffffff04;
        local_9 = ClauseCreator::Result::ok(&local_58);
        in_stack_ffffffffffffff00.rep_ = CONCAT13(local_9,(int3)in_stack_ffffffffffffff00.rep_);
      }
      in_stack_fffffffffffffef8 = (ProgramBuilder *)Literal::unflag(&local_48);
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_int_&,_true>
                (&local_78,(Literal *)in_stack_fffffffffffffef8,(int *)&local_44);
      x.second = in_stack_ffffffffffffff04;
      x.first.rep_ = in_stack_ffffffffffffff00.rep_;
      ProgramBuilder::addMinLit(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,x);
      local_28 = local_28 + 1;
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               in_stack_ffffffffffffff10);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1caed4);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1caee1);
  }
  if ((local_9 & 1) != 0) {
    pSVar6 = ProgramBuilder::ctx(in_RDI);
    bVar3 = SharedContext::preserveModels(pSVar6);
    local_94 = 1;
    while( true ) {
      sVar9 = local_94;
      sVar5 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 1));
      uVar2 = in_stack_fffffffffffffef4 & 0xffffff;
      if (sVar9 != sVar5) {
        uVar2 = CONCAT13(local_9,(int3)in_stack_fffffffffffffef4);
      }
      in_stack_fffffffffffffef4 = uVar2;
      if ((in_stack_fffffffffffffef4 & 0x1000000) == 0) break;
      pbVar7 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 1),
                          local_94);
      if ((*pbVar7 & 0xc) != 0xc) {
        if (*pbVar7 == 0) {
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            ProgramBuilder::ctx(in_RDI);
            SharedContext::eliminate
                      ((SharedContext *)CONCAT44(in_stack_fffffffffffffef4,sVar9),
                       in_stack_fffffffffffffeec);
          }
        }
        else {
          ProgramBuilder::ctx(in_RDI);
          SharedContext::setNant
                    ((SharedContext *)CONCAT44(in_stack_fffffffffffffef4,sVar9),
                     in_stack_fffffffffffffeec,SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
          ProgramBuilder::ctx(in_RDI);
          SharedContext::master((SharedContext *)0x1cb001);
          Solver::setPref((Solver *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.rep_),
                          (Var)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                          (Value)in_stack_fffffffffffffef8,
                          (ValueRep)(in_stack_fffffffffffffef4 >> 0x18));
        }
      }
      local_94 = local_94 + 1;
    }
    ProgramBuilder::markOutputVariables((ProgramBuilder *)in_stack_ffffffffffffff20);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool SatBuilder::doEndProgram() {
	bool ok = ctx()->ok();
	if (!softClauses_.empty() && ok) {
		ctx()->setPreserveModels(true);
		uint32 softVars = vars_ - ctx()->numVars();
		ctx()->addVars(softVars, Var_t::Atom, VarInfo::Nant);
		ctx()->startAddConstraints();
		LitVec cc;
		for (LitVec::const_iterator it = softClauses_.begin(), end = softClauses_.end(); it != end && ok; ++it) {
			weight_t w     = (weight_t)it->rep();
			Literal  relax = *++it;
			if (!relax.flagged()) {
				cc.assign(1, relax);
				do { cc.push_back(*++it); } while (!cc.back().flagged());
				cc.back().unflag();
				ok = ClauseCreator::create(*ctx()->master(), cc, Constraint_t::Static).ok();
			}
			addMinLit(0, WeightLiteral(relax.unflag(), w));
		}
		LitVec().swap(softClauses_);
	}
	if (ok) {
		const uint32 seen = 12;
		const bool   elim = !ctx()->preserveModels();
		for (Var v = 1; v != (Var)varState_.size() && ok; ++v) {
			uint32 m = varState_[v];
			if ( (m & seen) != seen ) {
				if      (m)   { ctx()->setNant(v, false); ctx()->master()->setPref(v, ValueSet::def_value, ValueRep(m >> 2)); }
				else if (elim){ ctx()->eliminate(v); }
			}
		}
		markOutputVariables();
	}
	return ok;
}